

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockTHUMB59TAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint8 y;
  long lVar9;
  uint8 *puVar10;
  uint8 paint_colors [4] [3];
  uint8 colors [2] [3];
  uint8 colorsRGB444 [2] [3];
  
  puVar10 = img + 3;
  if (channelsRGB == 3) {
    puVar10 = alpha;
  }
  colorsRGB444[0][0] = (byte)(block_part1 >> 0x17) & 0xf;
  colorsRGB444[0][1] = (byte)(block_part1 >> 0x13) & 0xf;
  colorsRGB444[0][2] = (byte)(block_part1 >> 0xf) & 0xf;
  colorsRGB444[1][0] = (byte)(block_part1 >> 0xb) & 0xf;
  colorsRGB444[1][1] = (byte)(block_part1 >> 7) & 0xf;
  colorsRGB444[1][2] = (byte)block_part1 >> 3 & 0xf;
  decompressColor(4,4,4,colorsRGB444,colors);
  calculatePaintColors59T((byte)block_part1 & 7,'\x01',colors,paint_colors);
  iVar3 = starty * width + startx;
  iVar7 = channelsRGB * iVar3;
  iVar5 = 0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar4 = iVar3;
    iVar8 = iVar7;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      uVar1 = iVar5 + (int)lVar9;
      uVar1 = (uint)((block_part2 >> (uVar1 & 0x1f) & 1) != 0) +
              (block_part2 >> ((byte)uVar1 & 0x1f | 0x10) & 1) * 2;
      img[iVar8] = paint_colors[uVar1][0];
      img[(long)iVar8 + 1] = paint_colors[uVar1][1];
      iVar6 = iVar4 << (channelsRGB != 3) * '\x02';
      img[(long)iVar8 + 2] = paint_colors[uVar1][2];
      if (uVar1 == 2) {
        puVar10[iVar6] = '\0';
        (img + iVar8)[0] = '\0';
        (img + iVar8)[1] = '\0';
        img[(long)iVar8 + 2] = '\0';
      }
      else {
        puVar10[iVar6] = 0xff;
      }
      iVar8 = iVar8 + channelsRGB * width;
      iVar4 = iVar4 + width;
    }
    iVar7 = iVar7 + channelsRGB;
    iVar3 = iVar3 + 1;
    iVar5 = iVar5 + 4;
  }
  return;
}

Assistant:

void decompressBlockTHUMB59TAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{

	uint8 colorsRGB444[2][3];
	uint8 colors[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 58);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 54);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 50);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 46);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 42);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 38);

	distance   = GETBITSHIGH(block_part1, TABLE_BITS_59T, 34);

	// Extend the two colors to RGB888	
	decompressColor(R_BITS59T, G_BITS59T, B_BITS59T, colorsRGB444, colors);	
	calculatePaintColors59T(distance, PATTERN_T, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channelsRGB*((starty+y)*width+startx+x)+R] = 
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channelsRGB*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channelsRGB*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
			if(block_mask[x][y]==2)  
			{
				alpha[channelsA*(x+startx+(y+starty)*width)]=0;
				img[channelsRGB*((starty+y)*width+startx+x)+R] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+G] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+B] =0;
			}
			else
				alpha[channelsA*(x+startx+(y+starty)*width)]=255;
		}
	}
}